

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O2

ssize_t __thiscall
MarkerIndex::splice(MarkerIndex *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,
                   size_t __len,uint __flags)

{
  unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
  *puVar1;
  flat_set<unsigned_int> *pfVar2;
  uint value;
  uint *puVar3;
  undefined8 uVar4;
  param_type pVar5;
  bool bVar6;
  int iVar7;
  Node *pNVar8;
  Node *pNVar9;
  size_t sVar10;
  iterator iVar11;
  mapped_type *ppNVar12;
  Point PVar13;
  uint in_register_0000000c;
  MarkerIndex *pMVar14;
  flat_set<unsigned_int> *pfVar15;
  param_type pVar16;
  uint *puVar17;
  undefined4 in_register_00000034;
  MarkerIndex *this_00;
  flat_set<unsigned_int> *pfVar18;
  MarkerId id;
  MarkerIdSet starting_inside_splice;
  MarkerIdSet ending_inside_splice;
  uint local_bc;
  Node *local_b8;
  Node *local_b0;
  MarkerIndex *local_a8;
  flat_set<unsigned_int> *local_a0;
  MarkerIndex *local_98;
  flat_set<unsigned_int> *local_90;
  Point local_88;
  Point local_80;
  undefined1 local_78 [32];
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  Node *local_48;
  Point local_38;
  
  pMVar14 = (MarkerIndex *)CONCAT44(in_register_00000034,__fdin);
  local_88.column = in_register_0000000c;
  local_88.row = __fdout;
  local_80 = (Point)__offin;
  local_38 = (Point)__offout;
  std::
  _Hashtable<const_MarkerIndex::Node_*,_std::pair<const_MarkerIndex::Node_*const,_Point>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>,_std::__detail::_Select1st,_std::equal_to<const_MarkerIndex::Node_*>,_std::hash<const_MarkerIndex::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(pMVar14->node_position_cache)._M_h);
  (this->end_nodes_by_id)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->end_nodes_by_id)._M_h._M_bucket_count = 0;
  (this->start_nodes_by_id)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->start_nodes_by_id)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->start_nodes_by_id)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->start_nodes_by_id)._M_h._M_rehash_policy = 0;
  (this->start_nodes_by_id)._M_h._M_bucket_count = 0;
  (this->start_nodes_by_id)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  this->root = (Node *)0x0;
  (this->start_nodes_by_id)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->random_engine)._M_x = 0;
  (this->random_distribution)._M_param = (param_type)0x0;
  if (pMVar14->root != (Node *)0x0) {
    bVar6 = Point::is_zero(&local_88);
    if ((bVar6) && (bVar6 = Point::is_zero(&stack0xffffffffffffffc8), bVar6)) {
      return (ssize_t)this;
    }
    bVar6 = Point::is_zero(&local_88);
    pNVar8 = Iterator::insert_splice_boundary(&pMVar14->iterator,&local_80,false);
    local_78._0_8_ = Point::traverse(&local_80,&local_88);
    pNVar9 = Iterator::insert_splice_boundary(&pMVar14->iterator,(Point *)local_78,bVar6);
    pNVar8->priority = -1;
    bubble_node_up(pMVar14,pNVar8);
    pNVar9->priority = -2;
    this_00 = pMVar14;
    bubble_node_up(pMVar14,pNVar9);
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_8_ = (Node *)0x0;
    local_58 = 0;
    iStack_54 = 0;
    iStack_50 = 0;
    iStack_4c = 0;
    local_48 = (Node *)0x0;
    local_b8 = pNVar9;
    local_b0 = pNVar8;
    local_a8 = pMVar14;
    local_98 = this;
    if (bVar6) {
      iVar11._M_current =
           (pNVar8->start_marker_ids).contents.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      pfVar2 = &pMVar14->exclusive_marker_ids;
      local_a0 = &pNVar8->right_marker_ids;
      pfVar15 = &pNVar9->start_marker_ids;
      while (iVar11._M_current !=
             (local_b0->start_marker_ids).contents.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        local_bc = *iVar11._M_current;
        this_00 = (MarkerIndex *)pfVar2;
        sVar10 = flat_set<unsigned_int>::count(pfVar2,local_bc);
        if (sVar10 == 0) {
          iVar11._M_current = iVar11._M_current + 1;
        }
        else {
          iVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                             (&(pNVar8->start_marker_ids).contents,iVar11._M_current);
          flat_set<unsigned_int>::erase(local_a0,local_bc);
          flat_set<unsigned_int>::insert(pfVar15,local_bc);
          this_00 = (MarkerIndex *)&pMVar14->start_nodes_by_id;
          ppNVar12 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&pMVar14->start_nodes_by_id,&local_bc);
          *ppNVar12 = local_b8;
        }
      }
      local_90 = &local_b0->end_marker_ids;
      iVar11._M_current =
           (local_b0->end_marker_ids).contents.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      pfVar18 = &local_b8->end_marker_ids;
      puVar1 = &local_a8->end_nodes_by_id;
      while (iVar11._M_current !=
             (local_b0->end_marker_ids).contents.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        local_bc = *iVar11._M_current;
        sVar10 = flat_set<unsigned_int>::count(pfVar2,local_bc);
        if ((sVar10 == 0) ||
           (this_00 = (MarkerIndex *)pfVar15,
           sVar10 = flat_set<unsigned_int>::count(pfVar15,local_bc), sVar10 != 0)) {
          iVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                             (&local_90->contents,iVar11._M_current);
          sVar10 = flat_set<unsigned_int>::count(pfVar15,local_bc);
          if (sVar10 == 0) {
            flat_set<unsigned_int>::insert(local_a0,local_bc);
          }
          flat_set<unsigned_int>::insert(pfVar18,local_bc);
          this_00 = (MarkerIndex *)puVar1;
          ppNVar12 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)puVar1,&local_bc);
          *ppNVar12 = local_b8;
        }
        else {
          iVar11._M_current = iVar11._M_current + 1;
        }
      }
    }
    else {
      this_00 = pMVar14;
      get_starting_and_ending_markers_within_subtree
                (pMVar14,pNVar8->right,(MarkerIdSet *)local_78,
                 (MarkerIdSet *)&stack0xffffffffffffffa8);
      pVar5 = _iStack_50;
      local_a0 = &pNVar8->right_marker_ids;
      for (pVar16 = _local_58; pVar16 != pVar5; pVar16 = (param_type)((long)pVar16 + 4)) {
        local_bc = *(uint *)pVar16;
        flat_set<unsigned_int>::insert(&pNVar9->end_marker_ids,local_bc);
        sVar10 = flat_set<unsigned_int>::count((flat_set<unsigned_int> *)local_78,local_bc);
        if (sVar10 == 0) {
          flat_set<unsigned_int>::insert(local_a0,local_bc);
        }
        this_00 = (MarkerIndex *)&pMVar14->end_nodes_by_id;
        ppNVar12 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&pMVar14->end_nodes_by_id,&local_bc);
        *ppNVar12 = local_b8;
      }
      puVar3 = (local_b8->end_marker_ids).contents.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar15 = &local_a8->exclusive_marker_ids;
      pfVar2 = &local_b8->start_marker_ids;
      for (puVar17 = (local_b8->end_marker_ids).contents.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; uVar4 = local_78._8_8_, puVar17 != puVar3;
          puVar17 = puVar17 + 1) {
        value = *puVar17;
        this_00 = (MarkerIndex *)pfVar15;
        sVar10 = flat_set<unsigned_int>::count(pfVar15,value);
        if ((sVar10 != 0) &&
           (this_00 = (MarkerIndex *)pfVar2, sVar10 = flat_set<unsigned_int>::count(pfVar2,value),
           sVar10 == 0)) {
          this_00 = (MarkerIndex *)&stack0xffffffffffffffa8;
          flat_set<unsigned_int>::insert((flat_set<unsigned_int> *)this_00,value);
        }
      }
      puVar1 = &local_a8->start_nodes_by_id;
      for (PVar13 = (Point)local_78._0_8_; this = local_98, PVar13 != (Point)uVar4;
          PVar13 = (Point)((long)PVar13 + 4)) {
        local_bc = *(uint *)PVar13;
        flat_set<unsigned_int>::insert(pfVar2,local_bc);
        this_00 = (MarkerIndex *)puVar1;
        ppNVar12 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)puVar1,&local_bc);
        *ppNVar12 = local_b8;
      }
      local_90 = &local_b0->start_marker_ids;
      iVar11._M_current =
           (local_b0->start_marker_ids).contents.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      pfVar18 = &local_b0->end_marker_ids;
      while (iVar11._M_current !=
             (local_b0->start_marker_ids).contents.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        local_bc = *iVar11._M_current;
        this_00 = (MarkerIndex *)pfVar15;
        sVar10 = flat_set<unsigned_int>::count(pfVar15,local_bc);
        if ((sVar10 == 0) ||
           (this_00 = (MarkerIndex *)pfVar18,
           sVar10 = flat_set<unsigned_int>::count(pfVar18,local_bc), sVar10 != 0)) {
          iVar11._M_current = iVar11._M_current + 1;
        }
        else {
          iVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                             (&local_90->contents,iVar11._M_current);
          flat_set<unsigned_int>::erase(local_a0,local_bc);
          flat_set<unsigned_int>::insert(pfVar2,local_bc);
          ppNVar12 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)puVar1,&local_bc);
          *ppNVar12 = local_b8;
          this_00 = (MarkerIndex *)local_78;
          flat_set<unsigned_int>::insert((flat_set<unsigned_int> *)this_00,local_bc);
        }
      }
    }
    pNVar9 = local_b0;
    pNVar8 = local_b8;
    populate_splice_invalidation_sets
              (this_00,(SpliceResult *)this,local_b0,local_b8,(MarkerIdSet *)local_78,
               (MarkerIdSet *)&stack0xffffffffffffffa8);
    pMVar14 = local_a8;
    if (pNVar9->right != (Node *)0x0) {
      delete_subtree(local_a8,pNVar9->right);
      pNVar9->right = (Node *)0x0;
    }
    PVar13 = Point::traverse(&local_80,&stack0xffffffffffffffc8);
    pNVar8->left_extent = PVar13;
    bVar6 = Point::operator==(&pNVar9->left_extent,&pNVar8->left_extent);
    if (bVar6) {
      puVar3 = (pNVar8->start_marker_ids).contents.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar17 = (pNVar8->start_marker_ids).contents.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar17 != puVar3; puVar17 = puVar17 + 1) {
        local_bc = *puVar17;
        flat_set<unsigned_int>::insert(&pNVar9->start_marker_ids,local_bc);
        flat_set<unsigned_int>::insert(&pNVar9->right_marker_ids,local_bc);
        ppNVar12 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&pMVar14->start_nodes_by_id,&local_bc);
        *ppNVar12 = local_b0;
      }
      puVar3 = (local_b8->end_marker_ids).contents.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar2 = &local_b0->end_marker_ids;
      pfVar15 = &local_b8->left_marker_ids;
      pfVar18 = &local_b0->left_marker_ids;
      puVar1 = &local_a8->end_nodes_by_id;
      for (puVar17 = (local_b8->end_marker_ids).contents.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; this = local_98, pMVar14 = local_a8,
          puVar17 != puVar3; puVar17 = puVar17 + 1) {
        local_bc = *puVar17;
        flat_set<unsigned_int>::insert(pfVar2,local_bc);
        sVar10 = flat_set<unsigned_int>::count(pfVar15,local_bc);
        if (sVar10 != 0) {
          flat_set<unsigned_int>::insert(pfVar18,local_bc);
          flat_set<unsigned_int>::erase(pfVar15,local_bc);
        }
        ppNVar12 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)puVar1,&local_bc);
        *ppNVar12 = local_b0;
      }
      delete_node(local_a8,local_b8);
      pNVar9 = local_b0;
    }
    else {
      bVar6 = Node::is_marker_endpoint(pNVar8);
      if (bVar6) {
        iVar7 = generate_random_number(pMVar14);
        pNVar8->priority = iVar7;
        bubble_node_down(pMVar14,pNVar8);
      }
      else {
        delete_node(pMVar14,pNVar8);
      }
    }
    bVar6 = Node::is_marker_endpoint(pNVar9);
    if (bVar6) {
      iVar7 = generate_random_number(pMVar14);
      pNVar9->priority = iVar7;
      bubble_node_down(pMVar14,pNVar9);
    }
    else {
      delete_node(pMVar14,pNVar9);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffa8
              );
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  }
  return (ssize_t)this;
}

Assistant:

MarkerIndex::SpliceResult MarkerIndex::splice(Point start, Point old_extent, Point new_extent) {
  node_position_cache.clear();

  SpliceResult invalidated;

  if (!root || (old_extent.is_zero() && new_extent.is_zero())) return invalidated;

  bool is_insertion = old_extent.is_zero();
  Node *start_node = iterator.insert_splice_boundary(start, false);
  Node *end_node = iterator.insert_splice_boundary(start.traverse(old_extent), is_insertion);

  start_node->priority = -1;
  bubble_node_up(start_node);
  end_node->priority = -2;
  bubble_node_up(end_node);

  MarkerIdSet starting_inside_splice;
  MarkerIdSet ending_inside_splice;

  if (is_insertion) {
    for (auto iter = start_node->start_marker_ids.begin(); iter != start_node->start_marker_ids.end();) {
      MarkerId id = *iter;
      if (exclusive_marker_ids.count(id) > 0) {
        iter = start_node->start_marker_ids.erase(iter);
        start_node->right_marker_ids.erase(id);
        end_node->start_marker_ids.insert(id);
        start_nodes_by_id[id] = end_node;
      } else {
        ++iter;
      }
    }
    for (auto iter = start_node->end_marker_ids.begin(); iter != start_node->end_marker_ids.end();) {
      MarkerId id = *iter;
      if (exclusive_marker_ids.count(id) == 0 || end_node->start_marker_ids.count(id) > 0) {
        iter = start_node->end_marker_ids.erase(iter);
        if (end_node->start_marker_ids.count(id) == 0) {
          start_node->right_marker_ids.insert(id);
        }
        end_node->end_marker_ids.insert(id);
        end_nodes_by_id[id] = end_node;
      } else {
        ++iter;
      }
    }
  } else {
    get_starting_and_ending_markers_within_subtree(start_node->right, &starting_inside_splice, &ending_inside_splice);

    for (MarkerId id : ending_inside_splice) {
      end_node->end_marker_ids.insert(id);
      if (!starting_inside_splice.count(id)) {
        start_node->right_marker_ids.insert(id);
      }
      end_nodes_by_id[id] = end_node;
    }

    for (MarkerId id : end_node->end_marker_ids) {
      if (exclusive_marker_ids.count(id) && !end_node->start_marker_ids.count(id)) {
        ending_inside_splice.insert(id);
      }
    }

    for (MarkerId id : starting_inside_splice) {
      end_node->start_marker_ids.insert(id);
      start_nodes_by_id[id] = end_node;
    }

    for (auto iter = start_node->start_marker_ids.begin(); iter != start_node->start_marker_ids.end();) {
      MarkerId id = *iter;
      if (exclusive_marker_ids.count(id) && !start_node->end_marker_ids.count(id)) {
        iter = start_node->start_marker_ids.erase(iter);
        start_node->right_marker_ids.erase(id);
        end_node->start_marker_ids.insert(id);
        start_nodes_by_id[id] = end_node;
        starting_inside_splice.insert(id);
      } else {
        ++iter;
      }
    }
  }

  populate_splice_invalidation_sets(&invalidated, start_node, end_node, starting_inside_splice, ending_inside_splice);

  if (start_node->right) {
    delete_subtree(start_node->right);
    start_node->right = nullptr;
  }

  end_node->left_extent = start.traverse(new_extent);

  if (start_node->left_extent == end_node->left_extent) {
    for (MarkerId id : end_node->start_marker_ids) {
      start_node->start_marker_ids.insert(id);
      start_node->right_marker_ids.insert(id);
      start_nodes_by_id[id] = start_node;
    }

    for (MarkerId id : end_node->end_marker_ids) {
      start_node->end_marker_ids.insert(id);
      if (end_node->left_marker_ids.count(id) > 0) {
        start_node->left_marker_ids.insert(id);
        end_node->left_marker_ids.erase(id);
      }
      end_nodes_by_id[id] = start_node;
    }
    delete_node(end_node);
  } else if (end_node->is_marker_endpoint()) {
    end_node->priority = generate_random_number();
    bubble_node_down(end_node);
  } else {
    delete_node(end_node);
  }

  if (start_node->is_marker_endpoint()) {
    start_node->priority = generate_random_number();
    bubble_node_down(start_node);
  } else {
    delete_node(start_node);
  }

  return invalidated;
}